

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::ProxyClient::SetMeshLocalPrefix
          (Error *__return_storage_ptr__,ProxyClient *this,ByteArray *aMeshLocalPrefix)

{
  char cVar1;
  pointer puVar2;
  char *pcVar3;
  char *pcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  format_args args_00;
  writer write;
  writer local_b8;
  string local_b0;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  format_string_checker<char> local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  puVar2 = (aMeshLocalPrefix->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((long)(aMeshLocalPrefix->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 == 8) {
    if (*puVar2 == 0xfd) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (&this->mMeshLocalPrefix,aMeshLocalPrefix);
      return __return_storage_ptr__;
    }
    local_68._0_8_ = (ulong)(uint)local_68._4_4_ << 0x20;
    pcVar3 = "Thread Mesh-Local Prefix must start with fd00::/8";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "Thread Mesh-Local Prefix must start with fd00::/8";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x31;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_68.parse_funcs_[0] = (parse_func)0x0;
    local_b8.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&local_b8,pcVar3,"");
          goto LAB_001c9057;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()((writer *)&local_b8,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar4,"",&local_68);
    } while (pcVar3 != "");
LAB_001c9057:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"Thread Mesh-Local Prefix must start with fd00::/8",
               (string_view)ZEXT816(0x31),args_00);
    local_90 = kInvalidArgs;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
  }
  else {
    local_68.types_[0] = ulong_long_type;
    pcVar3 = "Thread Mesh-Local Prefix length must be {}";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "Thread Mesh-Local Prefix length must be {}";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x2a;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
    local_68.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<unsigned_long,fmt::v10::detail::compile_parse_context<char>>;
    local_b8.handler_ = &local_68;
    local_68.context_.types_ = local_68.types_;
    do {
      cVar1 = *pcVar3;
      pcVar4 = pcVar3;
      while (cVar1 != '{') {
        pcVar4 = pcVar4 + 1;
        if (pcVar4 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long>_>
          ::writer::operator()(&local_b8,pcVar3,"");
          goto LAB_001c8f6a;
        }
        cVar1 = *pcVar4;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_long>_>
      ::writer::operator()(&local_b8,pcVar3,pcVar4);
      pcVar3 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_long>&>
                         (pcVar4,"",&local_68);
    } while (pcVar3 != "");
LAB_001c8f6a:
    local_68._0_8_ = 8;
    fmt.size_ = 4;
    fmt.data_ = (char *)0x2a;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_b0,(v10 *)"Thread Mesh-Local Prefix length must be {}",fmt,args);
    local_90 = kInvalidArgs;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_b0._M_dataplus._M_p,
               local_b0._M_dataplus._M_p + local_b0._M_string_length);
  }
  __return_storage_ptr__->mCode = local_90;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error ProxyClient::SetMeshLocalPrefix(const ByteArray &aMeshLocalPrefix)
{
    constexpr uint8_t meshLocalPrefix[] = {0xfd};
    Error             error;

    VerifyOrExit(aMeshLocalPrefix.size() == kMeshLocalPrefixLength,
                 error = ERROR_INVALID_ARGS("Thread Mesh-Local Prefix length must be {}", kMeshLocalPrefixLength));
    VerifyOrExit(
        std::equal(aMeshLocalPrefix.begin(), aMeshLocalPrefix.begin() + sizeof(meshLocalPrefix), meshLocalPrefix),
        error = ERROR_INVALID_ARGS("Thread Mesh-Local Prefix must start with fd00::/8"));

    mMeshLocalPrefix = aMeshLocalPrefix;

exit:
    return error;
}